

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata160.cpp
# Opt level: O0

void __thiscall ByteData160_EqualsMatch_Test::TestBody(ByteData160_EqualsMatch_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_e0;
  AssertHelper local_c0;
  Message local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_;
  undefined1 local_98 [6];
  bool is_equals;
  undefined1 local_78 [8];
  ByteData160 byte_data2;
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  ByteData160 byte_data1;
  ByteData160_EqualsMatch_Test *this_local;
  
  byte_data1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,"1234567890123456789012345678901234567890",&local_49);
  cfd::core::ByteData160::ByteData160((ByteData160 *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_98,"1234567890123456789012345678901234567890",
             (allocator *)((long)&gtest_ar_.message_.ptr_ + 7));
  cfd::core::ByteData160::ByteData160((ByteData160 *)local_78,(string *)local_98);
  std::__cxx11::string::~string((string *)local_98);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  gtest_ar_.message_.ptr_._6_1_ =
       cfd::core::ByteData160::Equals((ByteData160 *)local_28,(ByteData160 *)local_78);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b0,(bool *)((long)&gtest_ar_.message_.ptr_ + 6),(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e0,(internal *)local_b0,(AssertionResult *)"is_equals","false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata160.cpp"
               ,0x6b,message);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  cfd::core::ByteData160::~ByteData160((ByteData160 *)local_78);
  cfd::core::ByteData160::~ByteData160((ByteData160 *)local_28);
  return;
}

Assistant:

TEST(ByteData160, EqualsMatch) {
  ByteData160 byte_data1 = ByteData160(
      "1234567890123456789012345678901234567890");
  ByteData160 byte_data2 = ByteData160(
      "1234567890123456789012345678901234567890");
  bool is_equals = byte_data1.Equals(byte_data2);

  EXPECT_TRUE(is_equals);
}